

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void upb_inttable_compact(upb_inttable *t,upb_Arena *a)

{
  double dVar1;
  _Bool _Var2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  upb_value val;
  uintptr_t key;
  upb_value val_1;
  upb_inttable new_t;
  uintptr_t max [17];
  size_t counts [17];
  upb_value local_1a8;
  uintptr_t local_1a0;
  uint local_194;
  upb_value local_190;
  size_t local_188;
  upb_inttable local_180;
  ulong local_148 [18];
  long local_b8 [17];
  
  memset(local_b8,0,0x88);
  memset(local_148,0,0x88);
  local_180.t.count = 0xffffffffffffffff;
  _Var2 = upb_inttable_next(t,&local_1a0,&local_1a8,(intptr_t *)&local_180);
  if (_Var2) {
    do {
      iVar6 = 0;
      if (local_1a0 == 0) {
        bVar9 = false;
      }
      else {
        bVar9 = (local_1a0 & local_1a0 - 1) != 0;
        if (local_1a0 != 1) {
          lVar4 = 0x3f;
          if (local_1a0 != 0) {
            for (; local_1a0 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          iVar6 = (int)lVar4;
        }
      }
      uVar7 = (uint)bVar9 + iVar6;
      if (0xf < uVar7) {
        uVar7 = 0x10;
      }
      uVar8 = (ulong)(uVar7 << 3);
      uVar5 = *(ulong *)((long)local_148 + uVar8);
      if (*(ulong *)((long)local_148 + uVar8) <= local_1a0) {
        uVar5 = local_1a0;
      }
      *(ulong *)((long)local_148 + uVar8) = uVar5;
      *(long *)((long)local_b8 + uVar8) = *(long *)((long)local_b8 + uVar8) + 1;
      _Var2 = upb_inttable_next(t,&local_1a0,&local_1a8,(intptr_t *)&local_180);
    } while (_Var2);
  }
  uVar3 = t->array_count + (t->t).count;
  uVar5 = 0x10;
  uVar8 = uVar3;
  do {
    if (local_b8[uVar5] != 0) {
      auVar11._8_4_ = (int)(uVar8 >> 0x20);
      auVar11._0_8_ = uVar8;
      auVar11._12_4_ = 0x45300000;
      if ((double)(1 << ((byte)uVar5 & 0x1f)) * 0.1 <=
          (auVar11._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) goto LAB_00122d53;
      uVar8 = uVar8 - local_b8[uVar5];
    }
    bVar9 = 1 < uVar5;
    uVar5 = uVar5 - 1;
  } while (bVar9);
  uVar5 = 0;
LAB_00122d53:
  if (uVar3 < uVar8) {
    __assert_fail("arr_count <= upb_inttable_count(t)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/hash/common.c"
                  ,0x2c6,"void upb_inttable_compact(upb_inttable *, upb_Arena *)");
  }
  local_188 = local_148[(int)uVar5] + 1;
  iVar6 = 0;
  lVar4 = uVar3 - uVar8;
  if ((lVar4 == 0) ||
     (auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20), auVar10._0_8_ = lVar4,
     auVar10._12_4_ = 0x45300000,
     dVar1 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 0.85 + 1.0,
     uVar5 = (ulong)dVar1,
     uVar5 = (long)(dVar1 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5, uVar5 == 0)) {
    bVar9 = false;
  }
  else {
    bVar9 = (uVar5 & uVar5 - 1) != 0;
    if (uVar5 != 1) {
      lVar4 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      iVar6 = (int)lVar4;
    }
  }
  local_194 = 0x10;
  if ((uint)bVar9 + iVar6 < 0x10) {
    local_194 = (uint)bVar9 + iVar6;
  }
  upb_inttable_sizedinit(&local_180,local_188,local_194,a);
  local_1a0 = 0xffffffffffffffff;
  _Var2 = upb_inttable_next(t,&local_1a8.val,&local_190,(intptr_t *)&local_1a0);
  if (_Var2) {
    do {
      upb_inttable_insert(&local_180,local_1a8.val,local_190,a);
      _Var2 = upb_inttable_next(t,&local_1a8.val,&local_190,(intptr_t *)&local_1a0);
    } while (_Var2);
  }
  if (local_180.array_size == local_188) {
    if (local_194 == local_180.t.size_lg2) {
      t->array_count = local_180.array_count;
      t->array = local_180.array;
      t->array_size = local_180.array_size;
      *(ulong *)&(t->t).size_lg2 = CONCAT71(local_180.t._17_7_,local_180.t.size_lg2);
      (t->t).entries = local_180.t.entries;
      (t->t).count = local_180.t.count;
      (t->t).mask = local_180.t.mask;
      (t->t).max_count = local_180.t.max_count;
      return;
    }
    __assert_fail("new_t.t.size_lg2 == hashsize_lg2",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/hash/common.c"
                  ,0x2db,"void upb_inttable_compact(upb_inttable *, upb_Arena *)");
  }
  __assert_fail("new_t.array_size == arr_size",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/hash/common.c"
                ,0x2da,"void upb_inttable_compact(upb_inttable *, upb_Arena *)");
}

Assistant:

void upb_inttable_compact(upb_inttable* t, upb_Arena* a) {
  /* A power-of-two histogram of the table keys. */
  size_t counts[UPB_MAXARRSIZE + 1] = {0};

  /* The max key in each bucket. */
  uintptr_t max[UPB_MAXARRSIZE + 1] = {0};

  {
    intptr_t iter = UPB_INTTABLE_BEGIN;
    uintptr_t key;
    upb_value val;
    while (upb_inttable_next(t, &key, &val, &iter)) {
      int bucket = log2ceil(key);
      max[bucket] = UPB_MAX(max[bucket], key);
      counts[bucket]++;
    }
  }

  /* Find the largest power of two that satisfies the MIN_DENSITY
   * definition (while actually having some keys). */
  size_t arr_count = upb_inttable_count(t);
  int size_lg2;
  upb_inttable new_t;

  for (size_lg2 = ARRAY_SIZE(counts) - 1; size_lg2 > 0; size_lg2--) {
    if (counts[size_lg2] == 0) {
      /* We can halve again without losing any entries. */
      continue;
    } else if (arr_count >= (1 << size_lg2) * MIN_DENSITY) {
      break;
    }

    arr_count -= counts[size_lg2];
  }

  UPB_ASSERT(arr_count <= upb_inttable_count(t));

  {
    /* Insert all elements into new, perfectly-sized table. */
    size_t arr_size = max[size_lg2] + 1; /* +1 so arr[max] will fit. */
    size_t hash_count = upb_inttable_count(t) - arr_count;
    size_t hash_size = hash_count ? (hash_count / MAX_LOAD) + 1 : 0;
    int hashsize_lg2 = log2ceil(hash_size);

    upb_inttable_sizedinit(&new_t, arr_size, hashsize_lg2, a);

    {
      intptr_t iter = UPB_INTTABLE_BEGIN;
      uintptr_t key;
      upb_value val;
      while (upb_inttable_next(t, &key, &val, &iter)) {
        upb_inttable_insert(&new_t, key, val, a);
      }
    }

    UPB_ASSERT(new_t.array_size == arr_size);
    UPB_ASSERT(new_t.t.size_lg2 == hashsize_lg2);
  }
  *t = new_t;
}